

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

bool __thiscall
vera::Scene::addBumpTexture(Scene *this,string *_name,string *_path,bool _flip,bool _verbose)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *__file;
  ostream *poVar4;
  mapped_type this_00;
  mapped_type *ppTVar5;
  TextureBump *tex;
  stat st;
  _Self local_38;
  byte local_2a;
  byte local_29;
  bool _verbose_local;
  string *psStack_28;
  bool _flip_local;
  string *_path_local;
  string *_name_local;
  Scene *this_local;
  
  local_2a = _verbose;
  local_29 = _flip;
  psStack_28 = _path;
  _path_local = _name;
  _name_local = (string *)this;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
       ::find(&this->textures,_name);
  st.__glibc_reserved[2] =
       (__syscall_slong_t)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
       ::end(&this->textures);
  bVar1 = std::operator==(&local_38,(_Self *)(st.__glibc_reserved + 2));
  if (bVar1) {
    __file = (char *)std::__cxx11::string::c_str();
    iVar2 = stat(__file,(stat *)&tex);
    if (iVar2 == 0) {
      this_00 = (mapped_type)operator_new(0x48);
      this_00->m_format = 0;
      this_00->m_type = 0;
      this_00->m_filter = LINEAR;
      this_00->m_wrap = REPEAT;
      *(undefined8 *)((long)&(this_00->m_path).field_2 + 8) = 0;
      this_00->m_width = 0;
      this_00->m_height = 0;
      (this_00->m_path)._M_string_length = 0;
      (this_00->m_path).field_2._M_allocated_capacity = 0;
      ((Texture *)&this_00->_vptr_Texture)->_vptr_Texture = (_func_int **)0x0;
      *(undefined8 *)&this_00->m_path = 0;
      this_00->m_vFlip = false;
      *(undefined3 *)&this_00->field_0x41 = 0;
      this_00->m_id = 0;
      TextureBump::TextureBump((TextureBump *)this_00);
      uVar3 = (*((Texture *)&this_00->_vptr_Texture)->_vptr_Texture[0x10])
                        (this_00,psStack_28,(ulong)local_29 & 1);
      if ((uVar3 & 1) != 0) {
        ppTVar5 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                  ::operator[](&this->textures,_path_local);
        *ppTVar5 = this_00;
        if ((local_2a & 1) != 0) {
          poVar4 = std::operator<<((ostream *)&std::cout,"// ");
          poVar4 = std::operator<<(poVar4,(string *)psStack_28);
          poVar4 = std::operator<<(poVar4," loaded and transform to normalmap as: ");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          poVar4 = std::operator<<((ostream *)&std::cout,"uniform sampler2D   ");
          poVar4 = std::operator<<(poVar4,(string *)_path_local);
          poVar4 = std::operator<<(poVar4,";");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          poVar4 = std::operator<<((ostream *)&std::cout,"uniform vec2        ");
          poVar4 = std::operator<<(poVar4,(string *)_path_local);
          poVar4 = std::operator<<(poVar4,"Resolution;");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        }
        return true;
      }
      if (this_00 != (mapped_type)0x0) {
        (*((Texture *)&this_00->_vptr_Texture)->_vptr_Texture[1])();
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error watching for file ");
      poVar4 = std::operator<<(poVar4,(string *)psStack_28);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
  }
  return false;
}

Assistant:

bool Scene::addBumpTexture(const std::string& _name, const std::string& _path, bool _flip, bool _verbose) {
    if (textures.find(_name) == textures.end()) {
        struct stat st;

        // If we can not get file stamp proably is not a file
        if (stat(_path.c_str(), &st) != 0 )
            std::cerr << "Error watching for file " << _path << std::endl;
        
        // If we can lets proceed creating a texgure
        else {
            TextureBump* tex = new TextureBump();

            // load an image into the texture
            if (tex->load(_path, _flip)) {

                // the image is loaded finish add the texture to the uniform list
                textures[_name] = (Texture*)tex;

                if (_verbose) {
                    std::cout << "// " << _path << " loaded and transform to normalmap as: " << std::endl;
                    std::cout << "uniform sampler2D   " << _name  << ";"<< std::endl;
                    std::cout << "uniform vec2        " << _name  << "Resolution;"<< std::endl;
                }

                return true;
            }
            else
                delete tex;
        }
    }
    return false;
}